

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

bool __thiscall
duckdb::BitpackingState<unsigned_int,_int>::Update<duckdb::EmptyBitpackingWriter>
          (BitpackingState<unsigned_int,_int> *this,uint value,bool is_valid)

{
  bool bVar1;
  uint uVar2;
  byte in_DL;
  uint in_ESI;
  BitpackingState<unsigned_int,_int> *in_RDI;
  bool success;
  byte local_21;
  bool local_17;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = (bool)(in_DL & 1);
  in_RDI->compression_buffer_validity[in_RDI->compression_buffer_idx] = bVar1;
  local_17 = false;
  if ((in_RDI->all_valid & 1U) != 0) {
    local_17 = bVar1;
  }
  in_RDI->all_valid = local_17;
  local_21 = 0;
  if ((in_RDI->all_invalid & 1U) != 0) {
    local_21 = bVar1 ^ 0xff;
  }
  in_RDI->all_invalid = (bool)(local_21 & 1);
  if (bVar1 != false) {
    in_RDI->compression_buffer[in_RDI->compression_buffer_idx] = in_ESI;
    uVar2 = MinValue<unsigned_int>(in_RDI->minimum,in_ESI);
    in_RDI->minimum = uVar2;
    uVar2 = MaxValue<unsigned_int>(in_RDI->maximum,in_ESI);
    in_RDI->maximum = uVar2;
  }
  in_RDI->compression_buffer_idx = in_RDI->compression_buffer_idx + 1;
  if (in_RDI->compression_buffer_idx == 0x800) {
    bVar1 = Flush<duckdb::EmptyBitpackingWriter>
                      ((BitpackingState<unsigned_int,_int> *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    Reset(in_RDI);
  }
  else {
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Update(T value, bool is_valid) {
		compression_buffer_validity[compression_buffer_idx] = is_valid;
		all_valid = all_valid && is_valid;
		all_invalid = all_invalid && !is_valid;

		if (is_valid) {
			compression_buffer[compression_buffer_idx] = value;
			minimum = MinValue<T>(minimum, value);
			maximum = MaxValue<T>(maximum, value);
		}

		compression_buffer_idx++;

		if (compression_buffer_idx == BITPACKING_METADATA_GROUP_SIZE) {
			bool success = Flush<OP>();
			Reset();
			return success;
		}
		return true;
	}